

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O1

void __thiscall cubeb_async_logger::stop(cubeb_async_logger *this)

{
  _Head_base<0UL,_cubeb_log_message_*,_false> _Var1;
  __pointer_type prVar2;
  __pointer_type prVar3;
  bool bVar4;
  
  LOCK();
  (this->shutdown_thread)._M_base._M_i = true;
  UNLOCK();
  if ((this->logging_thread)._M_id._M_thread != 0) {
    std::thread::join();
    if ((this->logging_thread)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->logging_thread)._M_id._M_thread = 0;
    prVar2 = (this->msg_queue)._M_b._M_p;
    do {
      prVar3 = prVar2;
      LOCK();
      prVar2 = (this->msg_queue)._M_b._M_p;
      bVar4 = prVar3 == prVar2;
      if (bVar4) {
        (this->msg_queue)._M_b._M_p = (__pointer_type)0x0;
        prVar2 = prVar3;
      }
      UNLOCK();
    } while (!bVar4);
    if (prVar3 != (__pointer_type)0x0) {
      _Var1._M_head_impl =
           (prVar3->data_)._M_t.
           super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>._M_t.
           super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>.
           super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl;
      if (_Var1._M_head_impl != (cubeb_log_message *)0x0) {
        operator_delete__(_Var1._M_head_impl);
      }
      (prVar3->data_)._M_t.
      super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>._M_t.
      super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>.
      super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl = (cubeb_log_message *)0x0;
      operator_delete(prVar3,0x18);
    }
    LOCK();
    (this->msg_queue_consumer)._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
  }
  return;
}

Assistant:

void stop()
  {
    assert(((g_cubeb_log_callback == cubeb_noop_log_callback) ||
            !g_cubeb_log_callback) &&
           "Only call stop after logging has been disabled.");
    shutdown_thread = true;
    if (logging_thread.get_id() != std::thread::id()) {
      logging_thread.join();
      logging_thread = std::thread();
      auto * owned_queue = msg_queue.load();
      // Check if the queue is being used. If not, grab ownership. If yes,
      // try again shortly. At this point, the logging thread has been joined,
      // so nothing is going to dequeue.
      // If there is a valid pointer here, then the real-time audio thread that
      // logs won't attempt to write into the queue, and instead drop the
      // message.
      while (!msg_queue.compare_exchange_weak(owned_queue, nullptr)) {
      }
      delete owned_queue;
      msg_queue_consumer.store(nullptr);
    }
  }